

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int64_t highbd_warp_error(WarpedMotionParams *wm,uint16_t *ref,int ref_width,int ref_height,
                         int ref_stride,uint16_t *dst,int dst_stride,int p_col,int p_row,int p_width
                         ,int p_height,int subsampling_x,int subsampling_y,int bd,int64_t best_error
                         ,uint8_t *segment_map,int segment_map_stride)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int in_ECX;
  int in_EDX;
  long in_R9;
  int in_stack_00000008;
  undefined4 in_stack_0000004c;
  int seg_x;
  int j;
  int i;
  ConvolveParams conv_params;
  uint16_t tmp [1024];
  int error_bsize_h;
  int error_bsize_w;
  int64_t gm_sumerr;
  int in_stack_fffffffffffff6d4;
  int in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  int local_8f8;
  int local_8f4;
  int local_8f0;
  int local_8ec;
  int local_8d8;
  int local_8d4;
  uint16_t *in_stack_fffffffffffff748;
  int stride;
  int in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  uint16_t *in_stack_fffffffffffff760;
  WarpedMotionParams *in_stack_fffffffffffff768;
  int in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7e0;
  ConvolveParams *in_stack_fffffffffffff7e8;
  int64_t local_90;
  
  local_90 = 0;
  if (p_row < 0x20) {
    local_8ec = p_row;
  }
  else {
    local_8ec = 0x20;
  }
  if (p_width < 0x20) {
    local_8f0 = p_width;
  }
  else {
    local_8f0 = 0x20;
  }
  get_conv_params(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4);
  stride = 0;
  local_8d4 = p_col;
  do {
    if (p_col + p_width <= local_8d4) {
      return local_90;
    }
    for (local_8d8 = dst_stride; local_8d8 < dst_stride + p_row; local_8d8 = local_8d8 + 0x20) {
      if (*(char *)(best_error + ((local_8d4 >> 5) * (int)segment_map + (local_8d8 >> 5))) != '\0')
      {
        if (local_8ec < (dst_stride + in_EDX) - local_8d8) {
          local_8f4 = local_8ec;
        }
        else {
          local_8f4 = (dst_stride + in_EDX) - local_8d8;
        }
        if (local_8f0 < (p_col + in_ECX) - local_8d4) {
          local_8f8 = local_8f0;
        }
        else {
          local_8f8 = (p_col + in_ECX) - local_8d4;
        }
        highbd_warp_plane(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                          in_stack_fffffffffffff75c,in_stack_fffffffffffff758,stride,
                          in_stack_fffffffffffff748,in_stack_fffffffffffff7a8,
                          in_stack_fffffffffffff7b0,in_stack_fffffffffffff7b8,
                          in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,
                          in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8,
                          in_stack_fffffffffffff7e0,in_stack_fffffffffffff7e8);
        if ((local_8f4 == 0x20) && (local_8f8 == 0x20)) {
          uVar1 = (*aom_highbd_sad32x32)
                            ((uint8_t *)((ulong)&stack0xfffffffffffff760 >> 1),0x20,
                             (uint8_t *)
                             ((ulong)(in_R9 + (long)local_8d8 * 2 +
                                     (long)(local_8d4 * in_stack_00000008) * 2) >> 1),
                             in_stack_00000008);
          uVar3 = (ulong)uVar1;
        }
        else {
          iVar2 = generic_sad_highbd((uint16_t *)&stack0xfffffffffffff760,0x20,
                                     (uint16_t *)
                                     (in_R9 + (long)local_8d8 * 2 +
                                     (long)(local_8d4 * in_stack_00000008) * 2),in_stack_00000008,
                                     local_8f4,local_8f8);
          uVar3 = (ulong)iVar2;
        }
        local_90 = uVar3 + local_90;
        if (CONCAT44(in_stack_0000004c,bd) < local_90) {
          return 0x7fffffffffffffff;
        }
      }
    }
    local_8d4 = local_8d4 + 0x20;
  } while( true );
}

Assistant:

static int64_t highbd_warp_error(WarpedMotionParams *wm,
                                 const uint16_t *const ref, int ref_width,
                                 int ref_height, int ref_stride,
                                 const uint16_t *const dst, int dst_stride,
                                 int p_col, int p_row, int p_width,
                                 int p_height, int subsampling_x,
                                 int subsampling_y, int bd, int64_t best_error,
                                 uint8_t *segment_map, int segment_map_stride) {
  int64_t gm_sumerr = 0;
  const int error_bsize_w = AOMMIN(p_width, WARP_ERROR_BLOCK);
  const int error_bsize_h = AOMMIN(p_height, WARP_ERROR_BLOCK);
  DECLARE_ALIGNED(32, uint16_t, tmp[WARP_ERROR_BLOCK * WARP_ERROR_BLOCK]);

  ConvolveParams conv_params = get_conv_params(0, 0, bd);
  conv_params.use_dist_wtd_comp_avg = 0;
  for (int i = p_row; i < p_row + p_height; i += WARP_ERROR_BLOCK) {
    for (int j = p_col; j < p_col + p_width; j += WARP_ERROR_BLOCK) {
      int seg_x = j >> WARP_ERROR_BLOCK_LOG;
      int seg_y = i >> WARP_ERROR_BLOCK_LOG;
      // Only compute the error if this block contains inliers from the motion
      // model
      if (!segment_map[seg_y * segment_map_stride + seg_x]) continue;
      // avoid warping extra 8x8 blocks in the padded region of the frame
      // when p_width and p_height are not multiples of WARP_ERROR_BLOCK
      const int warp_w = AOMMIN(error_bsize_w, p_col + ref_width - j);
      const int warp_h = AOMMIN(error_bsize_h, p_row + ref_height - i);
      highbd_warp_plane(wm, ref, ref_width, ref_height, ref_stride, tmp, j, i,
                        warp_w, warp_h, WARP_ERROR_BLOCK, subsampling_x,
                        subsampling_y, bd, &conv_params);

      if (warp_w == WARP_ERROR_BLOCK && warp_h == WARP_ERROR_BLOCK) {
        gm_sumerr += aom_highbd_sad32x32(
            CONVERT_TO_BYTEPTR(tmp), WARP_ERROR_BLOCK,
            CONVERT_TO_BYTEPTR(dst + j + i * dst_stride), dst_stride);
      } else {
        gm_sumerr +=
            generic_sad_highbd(tmp, WARP_ERROR_BLOCK, dst + j + i * dst_stride,
                               dst_stride, warp_w, warp_h);
      }

      if (gm_sumerr > best_error) return INT64_MAX;
    }
  }
  return gm_sumerr;
}